

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

scalar_function_t *
duckdb::GetIntegralDecompressFunctionInputSwitch
          (scalar_function_t *__return_storage_ptr__,LogicalType *input_type,
          LogicalType *result_type)

{
  uint uVar1;
  code *pcVar2;
  InternalException *pIVar3;
  string local_40;
  
  uVar1 = (uint)result_type;
  switch((uint)input_type & 0xff) {
  case 0x1c:
    uVar1 = uVar1 & 0xff;
    if (uVar1 < 0x1e) {
      if (uVar1 < 0xe) {
        if (uVar1 == 0xc) {
          pcVar2 = IntegralDecompressFunction<unsigned_char,short>;
        }
        else {
          if (uVar1 != 0xd) {
LAB_00ff108e:
            pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,
                       "Unexpected input type in GetIntegralDecompressFunctionSetSwitch","");
            InternalException::InternalException(pIVar3,&local_40);
            __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pcVar2 = IntegralDecompressFunction<unsigned_char,int>;
        }
      }
      else if (uVar1 == 0xe) {
        pcVar2 = IntegralDecompressFunction<unsigned_char,long>;
      }
      else {
        if (uVar1 != 0x1d) goto LAB_00ff108e;
        pcVar2 = IntegralDecompressFunction<unsigned_char,unsigned_short>;
      }
    }
    else if (uVar1 < 0x31) {
      if (uVar1 == 0x1e) {
        pcVar2 = IntegralDecompressFunction<unsigned_char,unsigned_int>;
      }
      else {
        if (uVar1 != 0x1f) goto LAB_00ff108e;
        pcVar2 = IntegralDecompressFunction<unsigned_char,unsigned_long>;
      }
    }
    else if (uVar1 == 0x31) {
      pcVar2 = IntegralDecompressFunction<unsigned_char,duckdb::uhugeint_t>;
    }
    else {
      if (uVar1 != 0x32) goto LAB_00ff108e;
      pcVar2 = IntegralDecompressFunction<unsigned_char,duckdb::hugeint_t>;
    }
    break;
  case 0x1d:
    uVar1 = uVar1 & 0xff;
    if (uVar1 < 0x1e) {
      if (uVar1 < 0xe) {
        if (uVar1 == 0xc) {
          pcVar2 = IntegralDecompressFunction<unsigned_short,short>;
        }
        else {
          if (uVar1 != 0xd) {
LAB_00ff10e4:
            pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,
                       "Unexpected input type in GetIntegralDecompressFunctionSetSwitch","");
            InternalException::InternalException(pIVar3,&local_40);
            __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pcVar2 = IntegralDecompressFunction<unsigned_short,int>;
        }
      }
      else if (uVar1 == 0xe) {
        pcVar2 = IntegralDecompressFunction<unsigned_short,long>;
      }
      else {
        if (uVar1 != 0x1d) goto LAB_00ff10e4;
        pcVar2 = IntegralDecompressFunction<unsigned_short,unsigned_short>;
      }
    }
    else if (uVar1 < 0x31) {
      if (uVar1 == 0x1e) {
        pcVar2 = IntegralDecompressFunction<unsigned_short,unsigned_int>;
      }
      else {
        if (uVar1 != 0x1f) goto LAB_00ff10e4;
        pcVar2 = IntegralDecompressFunction<unsigned_short,unsigned_long>;
      }
    }
    else if (uVar1 == 0x31) {
      pcVar2 = IntegralDecompressFunction<unsigned_short,duckdb::uhugeint_t>;
    }
    else {
      if (uVar1 != 0x32) goto LAB_00ff10e4;
      pcVar2 = IntegralDecompressFunction<unsigned_short,duckdb::hugeint_t>;
    }
    break;
  case 0x1e:
    uVar1 = uVar1 & 0xff;
    if (uVar1 < 0x1e) {
      if (uVar1 < 0xe) {
        if (uVar1 == 0xc) {
          pcVar2 = IntegralDecompressFunction<unsigned_int,short>;
        }
        else {
          if (uVar1 != 0xd) {
LAB_00ff0fe2:
            pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,
                       "Unexpected input type in GetIntegralDecompressFunctionSetSwitch","");
            InternalException::InternalException(pIVar3,&local_40);
            __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pcVar2 = IntegralDecompressFunction<unsigned_int,int>;
        }
      }
      else if (uVar1 == 0xe) {
        pcVar2 = IntegralDecompressFunction<unsigned_int,long>;
      }
      else {
        if (uVar1 != 0x1d) goto LAB_00ff0fe2;
        pcVar2 = IntegralDecompressFunction<unsigned_int,unsigned_short>;
      }
    }
    else if (uVar1 < 0x31) {
      if (uVar1 == 0x1e) {
        pcVar2 = IntegralDecompressFunction<unsigned_int,unsigned_int>;
      }
      else {
        if (uVar1 != 0x1f) goto LAB_00ff0fe2;
        pcVar2 = IntegralDecompressFunction<unsigned_int,unsigned_long>;
      }
    }
    else if (uVar1 == 0x31) {
      pcVar2 = IntegralDecompressFunction<unsigned_int,duckdb::uhugeint_t>;
    }
    else {
      if (uVar1 != 0x32) goto LAB_00ff0fe2;
      pcVar2 = IntegralDecompressFunction<unsigned_int,duckdb::hugeint_t>;
    }
    break;
  case 0x1f:
    uVar1 = uVar1 & 0xff;
    if (uVar1 < 0x1e) {
      if (uVar1 < 0xe) {
        if (uVar1 == 0xc) {
          pcVar2 = IntegralDecompressFunction<unsigned_long,short>;
        }
        else {
          if (uVar1 != 0xd) {
LAB_00ff1038:
            pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,
                       "Unexpected input type in GetIntegralDecompressFunctionSetSwitch","");
            InternalException::InternalException(pIVar3,&local_40);
            __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pcVar2 = IntegralDecompressFunction<unsigned_long,int>;
        }
      }
      else if (uVar1 == 0xe) {
        pcVar2 = IntegralDecompressFunction<unsigned_long,long>;
      }
      else {
        if (uVar1 != 0x1d) goto LAB_00ff1038;
        pcVar2 = IntegralDecompressFunction<unsigned_long,unsigned_short>;
      }
    }
    else if (uVar1 < 0x31) {
      if (uVar1 == 0x1e) {
        pcVar2 = IntegralDecompressFunction<unsigned_long,unsigned_int>;
      }
      else {
        if (uVar1 != 0x1f) goto LAB_00ff1038;
        pcVar2 = IntegralDecompressFunction<unsigned_long,unsigned_long>;
      }
    }
    else if (uVar1 == 0x31) {
      pcVar2 = IntegralDecompressFunction<unsigned_long,duckdb::uhugeint_t>;
    }
    else {
      if (uVar1 != 0x32) goto LAB_00ff1038;
      pcVar2 = IntegralDecompressFunction<unsigned_long,duckdb::hugeint_t>;
    }
    break;
  default:
    pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "Unexpected result type in GetIntegralDecompressFunctionInputSwitch","");
    InternalException::InternalException(pIVar3,&local_40);
    __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = pcVar2;
  __return_storage_ptr__->_M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  return (scalar_function_t *)
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_manager;
}

Assistant:

static scalar_function_t GetIntegralDecompressFunctionInputSwitch(const LogicalType &input_type,
                                                                  const LogicalType &result_type) {
	switch (input_type.id()) {
	case LogicalTypeId::UTINYINT:
		return GetIntegralDecompressFunctionResultSwitch<uint8_t>(input_type, result_type);
	case LogicalTypeId::USMALLINT:
		return GetIntegralDecompressFunctionResultSwitch<uint16_t>(input_type, result_type);
	case LogicalTypeId::UINTEGER:
		return GetIntegralDecompressFunctionResultSwitch<uint32_t>(input_type, result_type);
	case LogicalTypeId::UBIGINT:
		return GetIntegralDecompressFunctionResultSwitch<uint64_t>(input_type, result_type);
	default:
		throw InternalException("Unexpected result type in GetIntegralDecompressFunctionInputSwitch");
	}
}